

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O2

GLFWbool openJoystickDevice(char *path)

{
  int iVar1;
  int iVar2;
  int iVar3;
  GLFWbool extraout_EAX;
  int *piVar4;
  ulong uVar5;
  _GLFWjoystick *js;
  uint uVar6;
  int hatCount;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  char evBits [4];
  input_id id;
  char absBits [8];
  char guid [33];
  char keyBits [96];
  char name [256];
  int local_1f54;
  char local_1f50 [4096];
  int aiStack_f50 [512];
  int aiStack_750 [64];
  undefined1 local_650 [1568];
  
  memset(name,0,0x100);
  guid[0x10] = '\0';
  guid[0x11] = '\0';
  guid[0x12] = '\0';
  guid[0x13] = '\0';
  guid[0x14] = '\0';
  guid[0x15] = '\0';
  guid[0x16] = '\0';
  guid[0x17] = '\0';
  guid[0x18] = '\0';
  guid[0x19] = '\0';
  guid[0x1a] = '\0';
  guid[0x1b] = '\0';
  guid[0x1c] = '\0';
  guid[0x1d] = '\0';
  guid[0x1e] = '\0';
  guid[0x1f] = '\0';
  evBits[0] = '\0';
  evBits[1] = '\0';
  evBits[2] = '\0';
  evBits[3] = '\0';
  guid[0] = '\0';
  guid[1] = '\0';
  guid[2] = '\0';
  guid[3] = '\0';
  guid[4] = '\0';
  guid[5] = '\0';
  guid[6] = '\0';
  guid[7] = '\0';
  guid[8] = '\0';
  guid[9] = '\0';
  guid[10] = '\0';
  guid[0xb] = '\0';
  guid[0xc] = '\0';
  guid[0xd] = '\0';
  guid[0xe] = '\0';
  guid[0xf] = '\0';
  guid[0x20] = '\0';
  keyBits[0x50] = '\0';
  keyBits[0x51] = '\0';
  keyBits[0x52] = '\0';
  keyBits[0x53] = '\0';
  keyBits[0x54] = '\0';
  keyBits[0x55] = '\0';
  keyBits[0x56] = '\0';
  keyBits[0x57] = '\0';
  keyBits[0x58] = '\0';
  keyBits[0x59] = '\0';
  keyBits[0x5a] = '\0';
  keyBits[0x5b] = '\0';
  keyBits[0x5c] = '\0';
  keyBits[0x5d] = '\0';
  keyBits[0x5e] = '\0';
  keyBits[0x5f] = '\0';
  keyBits[0x40] = '\0';
  keyBits[0x41] = '\0';
  keyBits[0x42] = '\0';
  keyBits[0x43] = '\0';
  keyBits[0x44] = '\0';
  keyBits[0x45] = '\0';
  keyBits[0x46] = '\0';
  keyBits[0x47] = '\0';
  keyBits[0x48] = '\0';
  keyBits[0x49] = '\0';
  keyBits[0x4a] = '\0';
  keyBits[0x4b] = '\0';
  keyBits[0x4c] = '\0';
  keyBits[0x4d] = '\0';
  keyBits[0x4e] = '\0';
  keyBits[0x4f] = '\0';
  keyBits[0x30] = '\0';
  keyBits[0x31] = '\0';
  keyBits[0x32] = '\0';
  keyBits[0x33] = '\0';
  keyBits[0x34] = '\0';
  keyBits[0x35] = '\0';
  keyBits[0x36] = '\0';
  keyBits[0x37] = '\0';
  keyBits[0x38] = '\0';
  keyBits[0x39] = '\0';
  keyBits[0x3a] = '\0';
  keyBits[0x3b] = '\0';
  keyBits[0x3c] = '\0';
  keyBits[0x3d] = '\0';
  keyBits[0x3e] = '\0';
  keyBits[0x3f] = '\0';
  keyBits[0x20] = '\0';
  keyBits[0x21] = '\0';
  keyBits[0x22] = '\0';
  keyBits[0x23] = '\0';
  keyBits[0x24] = '\0';
  keyBits[0x25] = '\0';
  keyBits[0x26] = '\0';
  keyBits[0x27] = '\0';
  keyBits[0x28] = '\0';
  keyBits[0x29] = '\0';
  keyBits[0x2a] = '\0';
  keyBits[0x2b] = '\0';
  keyBits[0x2c] = '\0';
  keyBits[0x2d] = '\0';
  keyBits[0x2e] = '\0';
  keyBits[0x2f] = '\0';
  keyBits[0x10] = '\0';
  keyBits[0x11] = '\0';
  keyBits[0x12] = '\0';
  keyBits[0x13] = '\0';
  keyBits[0x14] = '\0';
  keyBits[0x15] = '\0';
  keyBits[0x16] = '\0';
  keyBits[0x17] = '\0';
  keyBits[0x18] = '\0';
  keyBits[0x19] = '\0';
  keyBits[0x1a] = '\0';
  keyBits[0x1b] = '\0';
  keyBits[0x1c] = '\0';
  keyBits[0x1d] = '\0';
  keyBits[0x1e] = '\0';
  keyBits[0x1f] = '\0';
  keyBits[0] = '\0';
  keyBits[1] = '\0';
  keyBits[2] = '\0';
  keyBits[3] = '\0';
  keyBits[4] = '\0';
  keyBits[5] = '\0';
  keyBits[6] = '\0';
  keyBits[7] = '\0';
  keyBits[8] = '\0';
  keyBits[9] = '\0';
  keyBits[10] = '\0';
  keyBits[0xb] = '\0';
  keyBits[0xc] = '\0';
  keyBits[0xd] = '\0';
  keyBits[0xe] = '\0';
  keyBits[0xf] = '\0';
  absBits[0] = '\0';
  absBits[1] = '\0';
  absBits[2] = '\0';
  absBits[3] = '\0';
  absBits[4] = '\0';
  absBits[5] = '\0';
  absBits[6] = '\0';
  absBits[7] = '\0';
  memset(local_1f50,0,0x1f20);
  pcVar7 = _glfw.joysticks[0].linjs.path;
  lVar8 = 0x10;
  while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
    if ((*(int *)(pcVar7 + -0x74) != 0) && (iVar1 = strcmp(pcVar7,path), iVar1 == 0)) {
      return 0;
    }
    pcVar7 = pcVar7 + 0x1f98;
  }
  iVar1 = open(path,0x800);
  if (iVar1 != -1) {
    local_1f54 = iVar1;
    iVar2 = ioctl(iVar1,0x80044520,evBits);
    if ((((iVar2 < 0) || (iVar2 = ioctl(iVar1,0x80604521,keyBits), iVar2 < 0)) ||
        (iVar2 = ioctl(iVar1,0x80084523,absBits), iVar2 < 0)) ||
       (iVar2 = ioctl(iVar1,0x80084502,&id), iVar2 < 0)) {
      piVar4 = __errno_location();
      pcVar7 = strerror(*piVar4);
      _glfwInputError(0x10008,"Linux: Failed to query input device: %s",pcVar7);
    }
    else if ((~evBits[0] & 10U) == 0) {
      iVar1 = ioctl(iVar1,0x81004506,name);
      if (iVar1 < 0) {
        strncpy(name,"Unknown",0x100);
      }
      if (id.version == 0 || (id.product == 0 || id.vendor == 0)) {
        sprintf(guid,"%02x%02x0000%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x00",
                (ulong)(byte)id.bustype,(ulong)(id.bustype >> 8),(ulong)(uint)(int)name[0],
                (ulong)(uint)(int)name[1],(ulong)(uint)(int)name[2],(ulong)(uint)(int)name[3],
                (ulong)(uint)(int)name[4],(ulong)(uint)(int)name[5],(ulong)(uint)(int)name[6],
                (ulong)(uint)(int)name[7],(ulong)(uint)(int)name[8],(ulong)(uint)(int)name[9],
                (ulong)(uint)(int)name[10]);
      }
      else {
        sprintf(guid,"%02x%02x0000%02x%02x0000%02x%02x0000%02x%02x0000",(ulong)(id.bustype & 0xff),
                (ulong)(id.bustype >> 8),(ulong)(id.vendor & 0xff),(ulong)(id.vendor >> 8),
                (ulong)(id.product & 0xff),(ulong)(id.product >> 8),(ulong)(id.version & 0xff),
                (ulong)(id.version >> 8));
      }
      iVar1 = 0;
      for (uVar5 = 0x100; uVar5 != 0x300; uVar5 = uVar5 + 1) {
        if (((byte)keyBits[uVar5 >> 3 & 0x1fffffff] >> ((uint)uVar5 & 7) & 1) != 0) {
          aiStack_f50[uVar5 - 0x100] = iVar1;
          iVar1 = iVar1 + 1;
        }
      }
      iVar2 = 0;
      hatCount = 0;
      for (uVar6 = 0; (int)uVar6 < 0x40; uVar6 = uVar6 + 1) {
        lVar8 = (long)(int)uVar6;
        aiStack_750[lVar8] = -1;
        if (((byte)absBits[(int)uVar6 / 8] >> (uVar6 & 7) & 1) != 0) {
          if ((uVar6 & 0xfffffff8) == 0x10) {
            aiStack_750[lVar8] = hatCount;
            hatCount = hatCount + 1;
            uVar6 = uVar6 + 1;
          }
          else {
            iVar3 = ioctl(local_1f54,(ulong)(uVar6 + 0x40 | 0x80184500),local_650 + lVar8 * 0x18);
            if (-1 < iVar3) {
              aiStack_750[lVar8] = iVar2;
              iVar2 = iVar2 + 1;
            }
          }
        }
      }
      js = _glfwAllocJoystick(name,guid,iVar2,iVar1,hatCount);
      iVar1 = local_1f54;
      if (js != (_GLFWjoystick *)0x0) {
        strncpy(local_1f50,path,0x1000);
        memcpy(&js->linjs,&local_1f54,0x1f24);
        pollAbsState(js);
        _glfwInputJoystick(js,0x40001);
        return extraout_EAX;
      }
    }
    iVar1 = close(iVar1);
  }
  return iVar1;
}

Assistant:

static GLFWbool openJoystickDevice(const char* path)
{
    int jid, code;
    char name[256] = "";
    char guid[33] = "";
    char evBits[(EV_CNT + 7) / 8] = {0};
    char keyBits[(KEY_CNT + 7) / 8] = {0};
    char absBits[(ABS_CNT + 7) / 8] = {0};
    int axisCount = 0, buttonCount = 0, hatCount = 0;
    struct input_id id;
    _GLFWjoystickLinux linjs = {0};
    _GLFWjoystick* js = NULL;

    for (jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        if (!_glfw.joysticks[jid].present)
            continue;
        if (strcmp(_glfw.joysticks[jid].linjs.path, path) == 0)
            return GLFW_FALSE;
    }

    linjs.fd = open(path, O_RDONLY | O_NONBLOCK);
    if (linjs.fd == -1)
        return GLFW_FALSE;

    if (ioctl(linjs.fd, EVIOCGBIT(0, sizeof(evBits)), evBits) < 0 ||
        ioctl(linjs.fd, EVIOCGBIT(EV_KEY, sizeof(keyBits)), keyBits) < 0 ||
        ioctl(linjs.fd, EVIOCGBIT(EV_ABS, sizeof(absBits)), absBits) < 0 ||
        ioctl(linjs.fd, EVIOCGID, &id) < 0)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Linux: Failed to query input device: %s",
                        strerror(errno));
        close(linjs.fd);
        return GLFW_FALSE;
    }

    // Ensure this device supports the events expected of a joystick
    if (!isBitSet(EV_KEY, evBits) || !isBitSet(EV_ABS, evBits))
    {
        close(linjs.fd);
        return GLFW_FALSE;
    }

    if (ioctl(linjs.fd, EVIOCGNAME(sizeof(name)), name) < 0)
        strncpy(name, "Unknown", sizeof(name));

    // Generate a joystick GUID that matches the SDL 2.0.5+ one
    if (id.vendor && id.product && id.version)
    {
        sprintf(guid, "%02x%02x0000%02x%02x0000%02x%02x0000%02x%02x0000",
                id.bustype & 0xff, id.bustype >> 8,
                id.vendor & 0xff,  id.vendor >> 8,
                id.product & 0xff, id.product >> 8,
                id.version & 0xff, id.version >> 8);
    }
    else
    {
        sprintf(guid, "%02x%02x0000%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x00",
                id.bustype & 0xff, id.bustype >> 8,
                name[0], name[1], name[2], name[3],
                name[4], name[5], name[6], name[7],
                name[8], name[9], name[10]);
    }

    for (code = BTN_MISC;  code < KEY_CNT;  code++)
    {
        if (!isBitSet(code, keyBits))
            continue;

        linjs.keyMap[code - BTN_MISC] = buttonCount;
        buttonCount++;
    }

    for (code = 0;  code < ABS_CNT;  code++)
    {
        linjs.absMap[code] = -1;
        if (!isBitSet(code, absBits))
            continue;

        if (code >= ABS_HAT0X && code <= ABS_HAT3Y)
        {
            linjs.absMap[code] = hatCount;
            hatCount++;
            // Skip the Y axis
            code++;
        }
        else
        {
            if (ioctl(linjs.fd, EVIOCGABS(code), &linjs.absInfo[code]) < 0)
                continue;

            linjs.absMap[code] = axisCount;
            axisCount++;
        }
    }

    js = _glfwAllocJoystick(name, guid, axisCount, buttonCount, hatCount);
    if (!js)
    {
        close(linjs.fd);
        return GLFW_FALSE;
    }

    strncpy(linjs.path, path, sizeof(linjs.path));
    memcpy(&js->linjs, &linjs, sizeof(linjs));

    pollAbsState(js);

    _glfwInputJoystick(js, GLFW_CONNECTED);
    return GLFW_TRUE;
}